

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int allocate_ack_eliciting_frame
              (quicly_conn_t *conn,quicly_send_context_t *s,size_t min_space,quicly_sent_t **sent,
              quicly_sent_acked_cb acked)

{
  int iVar1;
  st_quicly_sent_block_t *psVar2;
  quicly_sentmap_t *in_RCX;
  undefined8 in_RDI;
  quicly_sent_acked_cb in_R8;
  int ret;
  quicly_send_context_t *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = _do_allocate_frame((quicly_conn_t *)acked,unaff_retaddr,
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (int)((ulong)in_RDI >> 0x20));
  if (iVar1 == 0) {
    psVar2 = (st_quicly_sent_block_t *)quicly_sentmap_allocate(in_RCX,in_R8);
    in_RCX->head = psVar2;
    if (psVar2 == (st_quicly_sent_block_t *)0x0) {
      iVar1 = 0x201;
    }
  }
  return iVar1;
}

Assistant:

static int allocate_ack_eliciting_frame(quicly_conn_t *conn, quicly_send_context_t *s, size_t min_space, quicly_sent_t **sent,
                                        quicly_sent_acked_cb acked)
{
    int ret;

    if ((ret = _do_allocate_frame(conn, s, min_space, 1)) != 0)
        return ret;
    if ((*sent = quicly_sentmap_allocate(&conn->egress.loss.sentmap, acked)) == NULL)
        return PTLS_ERROR_NO_MEMORY;

    return ret;
}